

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::update(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *this,int p_col,
        number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        *p_work,int *p_idx,int num)

{
  uint *puVar1;
  uint uVar2;
  fpclass_type fVar3;
  undefined8 uVar4;
  int32_t iVar5;
  int *piVar6;
  int iVar7;
  long lVar8;
  cpp_dec_float<50U,_int,_void> *pcVar9;
  int iVar10;
  byte bVar11;
  fpclass_type *pfVar12;
  long lVar13;
  int32_t *piVar14;
  cpp_dec_float<50U,_int,_void> *pcVar15;
  int *piVar16;
  cpp_dec_float<50U,_int,_void> uu;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_148;
  int *local_110;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_108;
  int *local_100;
  cpp_dec_float<50U,_int,_void> local_f8;
  uint *local_c0;
  cpp_dec_float<50U,_int,_void> *local_b8;
  ulong local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  uint local_88;
  int *local_78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_70;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_88 = 0;
  local_f8.fpclass = cpp_dec_float_finite;
  local_f8.prec_elem = 10;
  local_f8.data._M_elems[0] = 0;
  local_f8.data._M_elems[1] = 0;
  local_f8.data._M_elems[2] = 0;
  local_f8.data._M_elems[3] = 0;
  local_f8.data._M_elems[4] = 0;
  local_f8.data._M_elems[5] = 0;
  local_f8.data._M_elems._24_5_ = 0;
  local_f8.data._M_elems[7]._1_3_ = 0;
  local_f8.data._M_elems._32_5_ = 0;
  local_f8.data._M_elems[9]._1_3_ = 0;
  local_f8.exp = 0;
  local_f8.neg = false;
  local_110 = (int *)CONCAT44(local_110._4_4_,p_col);
  local_68.fpclass = cpp_dec_float_finite;
  local_68.prec_elem = 10;
  local_68.data._M_elems[0] = 0;
  local_68.data._M_elems[1] = 0;
  local_68.data._M_elems[2] = 0;
  local_68.data._M_elems[3] = 0;
  local_68.data._M_elems[4] = 0;
  local_68.data._M_elems[5] = 0;
  local_68.data._M_elems._24_5_ = 0;
  local_68.data._M_elems[7]._1_3_ = 0;
  local_68.data._M_elems._32_5_ = 0;
  local_68.data._M_elems[9]._1_3_ = 0;
  local_68.exp = 0;
  local_68.neg = false;
  local_78 = p_idx;
  local_70 = p_work;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&local_148,1,(type *)0x0);
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_68,&local_148,&p_work[p_col].m_backend);
  local_f8.data._M_elems[0] = local_68.data._M_elems[0];
  local_f8.data._M_elems[1] = local_68.data._M_elems[1];
  local_f8.data._M_elems[2] = local_68.data._M_elems[2];
  local_f8.data._M_elems[3] = local_68.data._M_elems[3];
  local_f8.data._M_elems[4] = local_68.data._M_elems[4];
  local_f8.data._M_elems[5] = local_68.data._M_elems[5];
  local_f8.data._M_elems._24_5_ = local_68.data._M_elems._24_5_;
  local_f8.data._M_elems[7]._1_3_ = local_68.data._M_elems[7]._1_3_;
  local_f8.data._M_elems._32_5_ = local_68.data._M_elems._32_5_;
  local_f8.data._M_elems[9]._1_3_ = local_68.data._M_elems[9]._1_3_;
  local_f8.exp = local_68.exp;
  local_f8.neg = local_68.neg;
  local_f8.fpclass = local_68.fpclass;
  local_f8.prec_elem = local_68.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&p_work[p_col].m_backend,0.0);
  iVar7 = makeLvec(this,num,p_col);
  piVar6 = local_78;
  pcVar9 = &((this->l).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->m_backend;
  local_100 = (this->l).idx;
  iVar10 = local_78[(long)num + -1];
  local_108 = this;
  if (iVar10 != p_col) {
    local_c0 = (uint *)CONCAT44(local_c0._4_4_,iVar7);
    piVar16 = local_100 + iVar7;
    pfVar12 = &((pointer)pcVar9)[iVar7].m_backend.fpclass;
    lVar8 = 0;
    local_b8 = pcVar9;
    local_b0 = (ulong)(uint)num;
    do {
      *piVar16 = iVar10;
      pcVar15 = &local_70[iVar10].m_backend;
      local_148.fpclass = cpp_dec_float_finite;
      local_148.prec_elem = 10;
      local_148.data._M_elems[0] = 0;
      local_148.data._M_elems[1] = 0;
      local_148.data._M_elems[2] = 0;
      local_148.data._M_elems[3] = 0;
      local_148.data._M_elems[4] = 0;
      local_148.data._M_elems[5] = 0;
      local_148.data._M_elems[6] = 0;
      local_148.data._M_elems[7] = 0;
      local_148.data._M_elems[8] = 0;
      local_148.data._M_elems[9] = 0;
      local_148.exp = 0;
      local_148.neg = false;
      pcVar9 = &local_f8;
      if (&local_148 != pcVar15) {
        local_148.data._M_elems[8] = local_f8.data._M_elems[8];
        local_148.data._M_elems[9] =
             (uint)(CONCAT35(local_f8.data._M_elems[9]._1_3_,local_f8.data._M_elems._32_5_) >> 0x20)
        ;
        local_148.data._M_elems[4] = local_f8.data._M_elems[4];
        local_148.data._M_elems[5] = local_f8.data._M_elems[5];
        local_148.data._M_elems[6] = local_f8.data._M_elems[6];
        local_148.data._M_elems[7] =
             (uint)(CONCAT35(local_f8.data._M_elems[7]._1_3_,local_f8.data._M_elems._24_5_) >> 0x20)
        ;
        local_148.data._M_elems[0] = local_f8.data._M_elems[0];
        local_148.data._M_elems[1] = local_f8.data._M_elems[1];
        local_148.data._M_elems[2] = local_f8.data._M_elems[2];
        local_148.data._M_elems[3] = local_f8.data._M_elems[3];
        local_148.exp = local_f8.exp;
        local_148.neg = local_f8.neg;
        local_148.fpclass = local_f8.fpclass;
        local_148.prec_elem = local_f8.prec_elem;
        pcVar9 = pcVar15;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_148,pcVar9);
      *(ulong *)(((cpp_dec_float<50U,_int,_void> *)(pfVar12 + -0xc))->data)._M_elems =
           CONCAT44(local_148.data._M_elems[1],local_148.data._M_elems[0]);
      *(ulong *)(pfVar12 + -10) = CONCAT44(local_148.data._M_elems[3],local_148.data._M_elems[2]);
      *(ulong *)(pfVar12 + -8) = CONCAT44(local_148.data._M_elems[5],local_148.data._M_elems[4]);
      *(ulong *)(pfVar12 + -6) = CONCAT44(local_148.data._M_elems[7],local_148.data._M_elems[6]);
      *(ulong *)(pfVar12 + -4) = CONCAT44(local_148.data._M_elems[9],local_148.data._M_elems[8]);
      pfVar12[-2] = local_148.exp;
      *(bool *)(pfVar12 + -1) = local_148.neg;
      *(undefined8 *)pfVar12 = local_148._48_8_;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)pcVar15,0.0);
      iVar10 = piVar6[(long)(num + -1) + lVar8 + -1];
      piVar16 = piVar16 + 1;
      pfVar12 = pfVar12 + 0xe;
      lVar8 = lVar8 + -1;
    } while (iVar10 != (int)local_110);
    iVar7 = (int)local_c0 - (int)lVar8;
    num = (int)local_b0 + (int)lVar8;
    pcVar9 = local_b8;
  }
  lVar8 = (long)iVar7;
  local_100[lVar8] = (int)local_110;
  local_68.fpclass = cpp_dec_float_finite;
  local_68.prec_elem = 10;
  local_68.data._M_elems[0] = 0;
  local_68.data._M_elems[1] = 0;
  local_68.data._M_elems[2] = 0;
  local_68.data._M_elems[3] = 0;
  local_68.data._M_elems[4] = 0;
  local_68.data._M_elems[5] = 0;
  local_68.data._M_elems._24_5_ = 0;
  local_68.data._M_elems[7]._1_3_ = 0;
  local_68.data._M_elems._32_5_ = 0;
  local_68.data._M_elems[9]._1_3_ = 0;
  local_68.exp = 0;
  local_68.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&local_148,1,(type *)0x0);
  local_68.data._M_elems._32_5_ = local_f8.data._M_elems._32_5_;
  local_68.data._M_elems[9]._1_3_ = local_f8.data._M_elems[9]._1_3_;
  local_68.data._M_elems[4] = local_f8.data._M_elems[4];
  local_68.data._M_elems[5] = local_f8.data._M_elems[5];
  local_68.data._M_elems._24_5_ = local_f8.data._M_elems._24_5_;
  local_68.data._M_elems[7]._1_3_ = local_f8.data._M_elems[7]._1_3_;
  local_68.data._M_elems[0] = local_f8.data._M_elems[0];
  local_68.data._M_elems[1] = local_f8.data._M_elems[1];
  local_68.data._M_elems[2] = local_f8.data._M_elems[2];
  local_68.data._M_elems[3] = local_f8.data._M_elems[3];
  local_68.exp = local_f8.exp;
  local_68.neg = local_f8.neg;
  local_68.fpclass = local_f8.fpclass;
  local_68.prec_elem = local_f8.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=(&local_68,&local_148);
  if (local_68.data._M_elems[0] != 0 || local_68.fpclass != cpp_dec_float_finite) {
    local_68.neg = (bool)(local_68.neg ^ 1);
  }
  *(ulong *)((long)((pointer)pcVar9)[lVar8].m_backend.data._M_elems + 0x20) =
       CONCAT35(local_68.data._M_elems[9]._1_3_,local_68.data._M_elems._32_5_);
  puVar1 = (uint *)((long)((pointer)pcVar9)[lVar8].m_backend.data._M_elems + 0x10);
  *(undefined8 *)puVar1 = local_68.data._M_elems._16_8_;
  *(ulong *)(puVar1 + 2) = CONCAT35(local_68.data._M_elems[7]._1_3_,local_68.data._M_elems._24_5_);
  *(undefined8 *)((pointer)pcVar9)[lVar8].m_backend.data._M_elems = local_68.data._M_elems._0_8_;
  *(undefined8 *)((long)((pointer)pcVar9)[lVar8].m_backend.data._M_elems + 8) =
       local_68.data._M_elems._8_8_;
  ((pointer)pcVar9)[lVar8].m_backend.exp = local_68.exp;
  ((pointer)pcVar9)[lVar8].m_backend.neg = local_68.neg;
  ((pointer)pcVar9)[lVar8].m_backend.fpclass = local_68.fpclass;
  ((pointer)pcVar9)[lVar8].m_backend.prec_elem = local_68.prec_elem;
  if (1 < num) {
    local_b8 = &(local_108->maxabs).m_backend;
    local_c0 = (local_108->maxabs).m_backend.data._M_elems + 1;
    lVar13 = (ulong)(num - 2) + 1;
    local_110 = local_100 + lVar8;
    piVar14 = &((pointer)pcVar9)[lVar8 + 1].m_backend.prec_elem;
    do {
      local_110 = local_110 + 1;
      iVar10 = local_78[lVar13 + -1];
      *local_110 = iVar10;
      pcVar15 = &local_70[iVar10].m_backend;
      local_148.fpclass = cpp_dec_float_finite;
      local_148.prec_elem = 10;
      local_148.data._M_elems[0] = 0;
      local_148.data._M_elems[1] = 0;
      local_148.data._M_elems[2] = 0;
      local_148.data._M_elems[3] = 0;
      local_148.data._M_elems[4] = 0;
      local_148.data._M_elems[5] = 0;
      local_148.data._M_elems[6] = 0;
      local_148.data._M_elems[7] = 0;
      local_148.data._M_elems[8] = 0;
      local_148.data._M_elems[9] = 0;
      local_148.exp = 0;
      local_148.neg = false;
      pcVar9 = &local_f8;
      if (&local_148 != pcVar15) {
        local_148.data._M_elems[8] = local_f8.data._M_elems[8];
        local_148.data._M_elems[9] =
             (uint)(CONCAT35(local_f8.data._M_elems[9]._1_3_,local_f8.data._M_elems._32_5_) >> 0x20)
        ;
        local_148.data._M_elems[4] = local_f8.data._M_elems[4];
        local_148.data._M_elems[5] = local_f8.data._M_elems[5];
        local_148.data._M_elems[6] = local_f8.data._M_elems[6];
        local_148.data._M_elems[7] =
             (uint)(CONCAT35(local_f8.data._M_elems[7]._1_3_,local_f8.data._M_elems._24_5_) >> 0x20)
        ;
        local_148.data._M_elems[0] = local_f8.data._M_elems[0];
        local_148.data._M_elems[1] = local_f8.data._M_elems[1];
        local_148.data._M_elems[2] = local_f8.data._M_elems[2];
        local_148.data._M_elems[3] = local_f8.data._M_elems[3];
        local_148.exp = local_f8.exp;
        local_148.neg = local_f8.neg;
        local_148.fpclass = local_f8.fpclass;
        local_148.prec_elem = local_f8.prec_elem;
        pcVar9 = pcVar15;
      }
      local_b0 = lVar13;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_148,pcVar9);
      uVar4 = local_148._48_8_;
      bVar11 = local_148.neg;
      uVar2 = local_148.data._M_elems[0];
      local_100 = (int *)CONCAT44(local_100._4_4_,local_148.exp);
      local_a8 = CONCAT44(local_148.data._M_elems[2],local_148.data._M_elems[1]);
      uStack_a0 = CONCAT44(local_148.data._M_elems[4],local_148.data._M_elems[3]);
      local_98 = CONCAT44(local_148.data._M_elems[6],local_148.data._M_elems[5]);
      uStack_90 = CONCAT44(local_148.data._M_elems[8],local_148.data._M_elems[7]);
      local_88 = local_148.data._M_elems[9];
      fVar3 = local_148.fpclass;
      iVar5 = local_148.prec_elem;
      (((cpp_dec_float<50U,_int,_void> *)(piVar14 + -0xd))->data)._M_elems[0] =
           local_148.data._M_elems[0];
      piVar14[-4] = local_148.data._M_elems[9];
      *(undefined8 *)(piVar14 + -8) = local_98;
      *(undefined8 *)(piVar14 + -6) = uStack_90;
      *(undefined8 *)(piVar14 + -0xc) = local_a8;
      *(undefined8 *)(piVar14 + -10) = uStack_a0;
      piVar14[-3] = local_148.exp;
      *(bool *)(piVar14 + -2) = local_148.neg;
      piVar14[-1] = local_148.fpclass;
      *piVar14 = local_148.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)pcVar15,0.0);
      local_148.data._M_elems[9] = local_88;
      local_148.data._M_elems[5] = (uint)local_98;
      local_148.data._M_elems[6] = (uint)((ulong)local_98 >> 0x20);
      local_148.data._M_elems[7] = (uint)uStack_90;
      local_148.data._M_elems[8] = (uint)((ulong)uStack_90 >> 0x20);
      local_148.data._M_elems[1] = (uint)local_a8;
      local_148.data._M_elems[2] = (uint)((ulong)local_a8 >> 0x20);
      local_148.data._M_elems[3] = (uint)uStack_a0;
      local_148.data._M_elems[4] = (uint)((ulong)uStack_a0 >> 0x20);
      iVar10 = (int)local_100;
      local_148.exp = (int)local_100;
      local_148.neg = (bool)bVar11;
      if (((bool)bVar11 == true) && (fVar3 != cpp_dec_float_finite || uVar2 != 0)) {
        local_148.neg = false;
      }
      if (((fVar3 != cpp_dec_float_NaN) &&
          ((local_108->maxabs).m_backend.fpclass != cpp_dec_float_NaN)) &&
         (local_148.data._M_elems[0] = uVar2, local_148._48_8_ = uVar4,
         iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_148,local_b8), 0 < iVar7)) {
        if ((bool)bVar11 != false) {
          bVar11 = bVar11 ^ (fVar3 != cpp_dec_float_finite || uVar2 != 0);
        }
        (local_108->maxabs).m_backend.data._M_elems[0] = uVar2;
        local_c0[8] = local_88;
        *(undefined8 *)(local_c0 + 4) = local_98;
        *(undefined8 *)(local_c0 + 6) = uStack_90;
        *(undefined8 *)local_c0 = local_a8;
        *(undefined8 *)(local_c0 + 2) = uStack_a0;
        (local_108->maxabs).m_backend.exp = iVar10;
        (local_108->maxabs).m_backend.neg = (bool)bVar11;
        (local_108->maxabs).m_backend.fpclass = fVar3;
        (local_108->maxabs).m_backend.prec_elem = iVar5;
      }
      piVar14 = piVar14 + 0xe;
      lVar13 = local_b0 + -1;
    } while (lVar13 != 0 && 0 < (long)local_b0);
  }
  local_108->stat = OK;
  return;
}

Assistant:

void CLUFactor<R>::update(int p_col, R* p_work, const int* p_idx, int num)
{
   int ll, i, j;
   int* lidx;
   R* lval;
   R x, rezi;

   assert(p_work[p_col] != 0.0);
   rezi = 1 / p_work[p_col];
   p_work[p_col] = 0.0;

   ll = makeLvec(num, p_col);
   //   ll = fac->makeLvec(num, col);
   lval = l.val.data();
   lidx = l.idx;

   for(i = num - 1; (j = p_idx[i]) != p_col; --i)
   {
      lidx[ll] = j;
      lval[ll] = rezi * p_work[j];
      p_work[j] = 0.0;
      ++ll;
   }

   lidx[ll] = p_col;

   lval[ll] = 1 - rezi;
   ++ll;

   for(--i; i >= 0; --i)
   {
      j = p_idx[i];
      lidx[ll] = j;
      lval[ll] = x = rezi * p_work[j];
      p_work[j] = 0.0;
      ++ll;

      if(spxAbs(x) > maxabs)
         maxabs = spxAbs(x);
   }

   this->stat = SLinSolver<R>::OK;
}